

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::bitmaskI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  long lVar1;
  undefined1 local_48 [8];
  LaneArray<2> lanes;
  
  getLanesI64x2((LaneArray<2> *)local_48,this);
  if ((lanes._M_elems[0].field_0.func.super_IString.str._M_str == (char *)0x3) &&
     (lanes._M_elems[1].field_0.func.super_IString.str._M_str == (char *)0x3)) {
    (__return_storage_ptr__->field_0).i32 =
         lanes._M_elems[0].type.id._4_4_ >> 0x1e & 0xfffffffe | (uint)local_48._4_4_ >> 0x1f;
    (__return_storage_ptr__->type).id = 2;
    lVar1 = 0x18;
    do {
      ~Literal((Literal *)(local_48 + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                ,0x121,"int64_t wasm::Literal::geti64() const");
}

Assistant:

Literal Literal::bitmaskI64x2() const {
  uint32_t result = 0;
  LaneArray<2> lanes = getLanesI64x2();
  for (size_t i = 0; i < 2; ++i) {
    if (lanes[i].geti64() & (1ll << 63)) {
      result = result | (1 << i);
    }
  }
  return Literal(result);
}